

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqComms.cpp
# Opt level: O3

int __thiscall helics::zeromq::ZmqComms::processIncomingMessage(ZmqComms *this,message_t *msg)

{
  int iVar1;
  long lVar2;
  long lVar3;
  void *pvVar4;
  size_t sVar5;
  string_view message;
  ActionMessage M;
  ActionMessage Q;
  undefined1 local_1a0 [184];
  ActionMessage local_e8;
  
  lVar2 = zmq_msg_size(msg);
  if (lVar2 == 5) {
    lVar2 = zmq_msg_data(msg);
    lVar3 = zmq_msg_size(msg);
    local_1a0._0_8_ = local_1a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,lVar2,lVar3 + lVar2);
    iVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                    "close");
    if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
      operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
    }
    if (iVar1 == 0) {
      return -1;
    }
  }
  pvVar4 = (void *)zmq_msg_data(msg);
  sVar5 = zmq_msg_size(msg);
  ActionMessage::ActionMessage((ActionMessage *)local_1a0,pvVar4,sVar5);
  if ((int)local_1a0._0_4_ < cmd_invalid) {
    if ((local_1a0._0_4_ == cmd_protocol_priority) || (local_1a0._0_4_ == cmd_protocol)) {
LAB_0027d1ca:
      if (local_1a0._4_4_ == 0x16570bf) {
        iVar1 = -1;
        goto LAB_0027d212;
      }
      if (local_1a0._4_4_ == 1999) {
        CommsInterface::setRxStatus((CommsInterface *)this,CONNECTED);
      }
    }
  }
  else {
    if (local_1a0._0_4_ == cmd_protocol_big) goto LAB_0027d1ca;
    if (local_1a0._0_4_ == cmd_invalid) {
      message._M_str = "invalid command received";
      message._M_len = 0x18;
      CommsInterface::logError((CommsInterface *)this,message);
      pvVar4 = (void *)zmq_msg_data(msg);
      sVar5 = zmq_msg_size(msg);
      ActionMessage::ActionMessage(&local_e8,pvVar4,sVar5);
      ActionMessage::~ActionMessage(&local_e8);
      iVar1 = 0;
      goto LAB_0027d212;
    }
  }
  if ((this->super_NetworkCommsInterface).super_CommsInterface.ActionCallback.super__Function_base.
      _M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  iVar1 = 0;
  (*(this->super_NetworkCommsInterface).super_CommsInterface.ActionCallback._M_invoker)
            ((_Any_data *)&(this->super_NetworkCommsInterface).super_CommsInterface.ActionCallback,
             (ActionMessage *)local_1a0);
LAB_0027d212:
  ActionMessage::~ActionMessage((ActionMessage *)local_1a0);
  return iVar1;
}

Assistant:

int ZmqComms::processIncomingMessage(zmq::message_t& msg)
{
    if (msg.size() == 5) {
        std::string str(static_cast<char*>(msg.data()), msg.size());
        if (str == "close") {
            return (-1);
        }
    }
    ActionMessage M(static_cast<std::byte*>(msg.data()), msg.size());
    if (!isValidCommand(M)) {
        logError("invalid command received");
        ActionMessage Q(static_cast<std::byte*>(msg.data()), msg.size());
        return 0;
    }
    if (isProtocolCommand(M)) {
        switch (M.messageID) {
            case CLOSE_RECEIVER:
                return (-1);
            case RECONNECT_RECEIVER:
                setRxStatus(ConnectionStatus::CONNECTED);
                break;
            default:
                break;
        }
    }
    ActionCallback(std::move(M));
    return 0;
}